

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

Var BailOutRecord::BailOut(BailOutRecord *bailOutRecord)

{
  byte bVar1;
  ImplicitCallFlags savedImplicitCallFlags;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  JavascriptCallStackLayout *layout;
  RecyclableData *pRVar7;
  Var pvVar8;
  void *unaff_retaddr;
  
  if (bailOutRecord == (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x432,"(bailOutRecord)","bailOutRecord");
    if (!bVar4) goto LAB_003fa08c;
    *puVar6 = 0;
  }
  layout = GetStackLayout(bailOutRecord);
  lVar2 = *(long *)layout;
  pRVar7 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                     ((RecyclerRootPtr<ThreadContext::RecyclableData> *)
                      (*(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 8) + 8) + 0x490) + 0x3b8) +
                      0x10c8));
  if (((pRVar7->pendingFinallyException).ptr != (JavascriptExceptionObject *)0x0) &&
     (bailOutRecord->bailOutKind != BailOutOnException)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x443,
                       "(function->GetScriptContext()->GetThreadContext()->GetPendingFinallyException() == nullptr || bailOutRecord->bailOutKind == IR::BailOutOnException)"
                       ,
                       "function->GetScriptContext()->GetThreadContext()->GetPendingFinallyException() == nullptr || bailOutRecord->bailOutKind == IR::BailOutOnException"
                      );
    if (!bVar4) {
LAB_003fa08c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (bailOutRecord->bailOutKind == BailOutOnImplicitCalls) {
    ThreadContext::CheckAndResetImplicitCallAccessorFlag
              (*(ThreadContext **)(*(long *)(*(long *)(*(long *)(lVar2 + 8) + 8) + 0x490) + 0x3b8));
  }
  bVar1 = bailOutRecord->globalBailOutRecordTable->field_0x2c;
  if ((bVar1 & 4) == 0) {
    savedImplicitCallFlags =
         *(ImplicitCallFlags *)
          (*(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 8) + 8) + 0x490) + 0x3b8) + 0x1570);
    if ((bVar1 & 1) != 0) {
      pvVar8 = BailOutInlined(layout,bailOutRecord,unaff_retaddr,savedImplicitCallFlags);
      return pvVar8;
    }
    pvVar8 = BailOutFromFunction(layout,bailOutRecord,unaff_retaddr,(void *)0x0,
                                 savedImplicitCallFlags);
    return pvVar8;
  }
  if ((bVar1 & 1) == 0) {
    uVar5 = BailOutFromLoopBody(layout,bailOutRecord);
  }
  else {
    uVar5 = BailOutFromLoopBodyInlined(layout,bailOutRecord,unaff_retaddr);
  }
  return (Var)(ulong)uVar5;
}

Assistant:

Js::Var BailOutRecord::BailOut(BailOutRecord const * bailOutRecord)
{
    Assert(bailOutRecord);

    void * argoutRestoreAddr = nullptr;
#ifdef _M_IX86
    void * addressOfRetAddress = _AddressOfReturnAddress();
    if (bailOutRecord->ehBailoutData && (bailOutRecord->ehBailoutData->catchOffset != 0 || bailOutRecord->ehBailoutData->finallyOffset != 0 || bailOutRecord->ehBailoutData->ht == Js::HandlerType::HT_Finally))
    {
        // For a bailout in argument evaluation from an EH region, the esp is offset by the TryCatch helper's frame. So, the argouts are not at the offsets
        // stored in the bailout record, which are relative to ebp. Need to restore the argouts from the actual value of esp before calling the Bailout helper
        argoutRestoreAddr = (void *)((char*)addressOfRetAddress + ((1 + 1) * MachPtr)); // Account for the parameter and return address of this function
    }
#endif

    Js::JavascriptCallStackLayout *const layout = bailOutRecord->GetStackLayout();
    Js::ScriptFunction * function = (Js::ScriptFunction *)layout->functionObject;

    Assert(function->GetScriptContext()->GetThreadContext()->GetPendingFinallyException() == nullptr ||
        bailOutRecord->bailOutKind == IR::BailOutOnException);

    if (bailOutRecord->bailOutKind == IR::BailOutOnImplicitCalls)
    {
        function->GetScriptContext()->GetThreadContext()->CheckAndResetImplicitCallAccessorFlag();
    }

    Js::ImplicitCallFlags savedImplicitCallFlags = function->GetScriptContext()->GetThreadContext()->GetImplicitCallFlags();

    if(bailOutRecord->globalBailOutRecordTable->isLoopBody)
    {
        if (bailOutRecord->globalBailOutRecordTable->isInlinedFunction)
        {
            return reinterpret_cast<Js::Var>(BailOutFromLoopBodyInlined(layout, bailOutRecord, _ReturnAddress()));
        }
        return reinterpret_cast<Js::Var>(BailOutFromLoopBody(layout, bailOutRecord));
    }
    if(bailOutRecord->globalBailOutRecordTable->isInlinedFunction)
    {
        return BailOutInlined(layout, bailOutRecord, _ReturnAddress(), savedImplicitCallFlags);
    }
    return BailOutFromFunction(layout, bailOutRecord, _ReturnAddress(), argoutRestoreAddr, savedImplicitCallFlags);
}